

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall
rsg::AssignOp::AssignOp(AssignOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRange *this_00;
  Storage SVar1;
  Type TVar2;
  deRandom *pdVar3;
  ValueRangeAccess valueRange_00;
  ValueRangeAccess dst;
  ConstValueRangeAccess other;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  runtime_error *this_01;
  pointer ppVVar10;
  pointer pSVar11;
  pointer ppVVar12;
  long lVar13;
  int ndx_1;
  int iVar14;
  pointer ppVVar15;
  Scalar *pSVar16;
  pointer pSVar17;
  int ndx;
  ValueEntry *val;
  VariableManager *pVVar18;
  ValueEntry *pVVar19;
  pointer ppVVar20;
  float fVar21;
  ConstValueRangeAccess selectedRange;
  ValueRange local_148;
  ValueRange *local_c8;
  Scalar *pSStack_c0;
  Scalar *local_b8;
  ValueRange *local_b0;
  Scalar *pSStack_a8;
  Scalar *local_a0;
  ValueRange *local_98;
  Scalar *pSStack_90;
  Scalar *local_88;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_0218a5d0;
  this_00 = &this->m_valueRange;
  ValueRange::ValueRange(this_00,valueRange);
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_lvalueExpr = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_rvalueExpr = (Expression *)0x0;
  if ((this->m_valueRange).m_type.m_baseType == TYPE_VOID) {
    pVVar18 = state->m_varManager;
    iVar14 = state->m_shaderParams->maxCombinedVariableScalars - pVVar18->m_numAllocatedScalars;
    ppVVar20 = (pVVar18->m_entryCache).
               super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppVVar12 = (pVVar18->m_entryCache).
               super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (ppVVar10 = ppVVar12; ppVVar10 != ppVVar20; ppVVar10 = ppVVar10 + 1) {
      SVar1 = (*ppVVar10)->m_variable->m_storage;
      if ((SVar1 < STORAGE_LAST) && ((0xe5U >> (SVar1 & 0x1f) & 1) != 0)) {
        if (iVar14 < 1) goto joined_r0x0197f98f;
        fVar21 = deRandom_getFloat(&state->m_random->m_rnd);
        if (0.1 <= fVar21) {
          ppVVar12 = (state->m_varManager->m_entryCache).
                     super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVVar20 = (state->m_varManager->m_entryCache).
                     super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
joined_r0x0197f98f:
          while ((ppVVar12 != ppVVar20 &&
                 ((SVar1 = (*ppVVar12)->m_variable->m_storage, STORAGE_PARAMETER_INOUT < SVar1 ||
                  ((0xe5U >> (SVar1 & 0x1f) & 1) == 0))))) {
            ppVVar12 = (pointer)((long)ppVVar12 + 8);
          }
          pdVar3 = &state->m_random->m_rnd;
          pVVar19 = (ValueEntry *)0x0;
          iVar14 = 0;
          do {
            if ((iVar14 < 1) || (dVar8 = deRandom_getUint32(pdVar3), dVar8 % (iVar14 + 1U) == 0)) {
              pVVar19 = *ppVVar12;
            }
            ppVVar10 = ppVVar12 + 1;
            do {
              ppVVar12 = ppVVar10;
              if (ppVVar12 == ppVVar20) {
                pSStack_a8 = (pVVar19->m_valueRange).m_min.
                             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                             super__Vector_impl_data._M_start;
                local_a0 = (pVVar19->m_valueRange).m_max.
                           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                           super__Vector_impl_data._M_start;
                if (pSStack_a8 ==
                    (pVVar19->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pSStack_a8 = (Scalar *)0x0;
                }
                if (local_a0 ==
                    (pVVar19->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_a0 = (Scalar *)0x0;
                }
                local_b0 = &pVVar19->m_valueRange;
                other.m_min = pSStack_a8;
                other.m_type = &local_b0->m_type;
                other.m_max = local_a0;
                ValueRange::ValueRange(&local_148,other);
                VariableType::operator=(&this_00->m_type,&local_148.m_type);
                std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
                          (&(this->m_valueRange).m_min,&local_148.m_min);
                std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
                          (&(this->m_valueRange).m_max,&local_148.m_max);
                ValueRange::~ValueRange(&local_148);
                pSVar17 = (this->m_valueRange).m_min.
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (pSVar17 ==
                    (this->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pSVar17 = (pointer)0x0;
                }
                pSVar11 = (this->m_valueRange).m_max.
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (pSVar11 ==
                    (this->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pSVar11 = (pointer)0x0;
                }
                TVar2 = (this->m_valueRange).m_type.m_baseType;
                if (TVar2 != TYPE_BOOL) {
                  pdVar3 = &state->m_random->m_rnd;
                  if (TVar2 == TYPE_INT) {
                    if (0 < (this->m_valueRange).m_type.m_numElements) {
                      lVar13 = 0;
                      do {
                        VariableType::getElementType(&this_00->m_type);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < (this->m_valueRange).m_type.m_numElements);
                    }
                  }
                  else {
                    if (TVar2 != TYPE_FLOAT) {
                      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_148.m_type._0_8_ = &local_148.m_type.m_typeName._M_string_length;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_148,
                                 "computeRandomValueRangeForInfElements(): unsupported type","");
                      std::runtime_error::runtime_error(this_01,(string *)&local_148);
                      *(undefined ***)this_01 = &PTR__runtime_error_0218a298;
                      __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
                    }
                    if (0 < (this->m_valueRange).m_type.m_numElements) {
                      lVar13 = 0;
                      do {
                        VariableType::getElementType(&this_00->m_type);
                        if ((pSVar17[lVar13].intVal == -0x800000) &&
                           (VariableType::getElementType(&this_00->m_type),
                           pSVar11[lVar13].intVal == 0x7f800000)) {
                          dVar8 = deRandom_getUint32(pdVar3);
                          dVar9 = deRandom_getUint32(pdVar3);
                          fVar21 = (float)(int)(dVar9 % (0x141 - dVar8 % 0x141)) * 0.1 + -16.0;
                          VariableType::getElementType(&this_00->m_type);
                          pSVar17[lVar13].floatVal = fVar21;
                          VariableType::getElementType(&this_00->m_type);
                          pSVar11[lVar13].floatVal = (float)(dVar8 % 0x141) * 0.1 + fVar21;
                        }
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < (this->m_valueRange).m_type.m_numElements);
                    }
                  }
                }
                goto LAB_0197f6b4;
              }
              SVar1 = (*ppVVar12)->m_variable->m_storage;
              ppVVar10 = ppVVar12 + 1;
            } while ((STORAGE_PARAMETER_INOUT < SVar1) || ((0xe5U >> (SVar1 & 0x1f) & 1) == 0));
            iVar14 = iVar14 + 1;
          } while( true );
        }
        break;
      }
    }
    computeRandomType(&local_80,state,iVar14);
    ValueRange::ValueRange(&local_148,&local_80);
    VariableType::operator=(&this_00->m_type,&local_148.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&(this->m_valueRange).m_min,&local_148.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&(this->m_valueRange).m_max,&local_148.m_max);
    ValueRange::~ValueRange(&local_148);
    VariableType::~VariableType(&local_80);
    pSStack_90 = (this->m_valueRange).m_min.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_88 = (this->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pSStack_90 ==
        (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSStack_90 = (Scalar *)0x0;
    }
    if (local_88 ==
        (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_88 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_90;
    valueRange_00.super_ConstValueRangeAccess.m_type = &this_00->m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_88;
    local_98 = this_00;
    computeRandomValueRange(state,valueRange_00);
  }
LAB_0197f6b4:
  pVVar18 = state->m_varManager;
  local_148.m_type.m_typeName._M_dataplus._M_p =
       (pointer)(this->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_148.m_type.m_typeName._M_string_length =
       (size_type)
       (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if ((pointer)local_148.m_type.m_typeName._M_dataplus._M_p ==
      (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_148.m_type.m_typeName._M_dataplus._M_p = (pointer)(pointer)0x0;
  }
  if ((pointer)local_148.m_type.m_typeName._M_string_length ==
      (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_148.m_type.m_typeName._M_string_length = (size_type)(pointer)0x0;
  }
  ppVVar12 = (pVVar18->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar20 = ppVVar12;
  local_148.m_type._0_8_ = this_00;
  if (ppVVar12 !=
      (pVVar18->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      bVar7 = rsg::anon_unknown_0::IsWritableIntersectingEntry::operator()
                        ((IsWritableIntersectingEntry *)&local_148,*ppVVar12);
      ppVVar20 = (pVVar18->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar7) break;
      ppVVar12 = ppVVar12 + 1;
    } while (ppVVar12 != ppVVar20);
    pVVar18 = state->m_varManager;
  }
  sVar6 = local_148.m_type.m_typeName._M_string_length;
  _Var5._M_p = local_148.m_type.m_typeName._M_dataplus._M_p;
  uVar4 = local_148.m_type._0_8_;
  ppVVar10 = (pVVar18->m_entryCache).
             super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  bVar7 = rsg::anon_unknown_0::canAllocateVariable(state,&this_00->m_type);
  if ((!bVar7) ||
     ((ppVVar12 != ppVVar10 && (fVar21 = deRandom_getFloat(&state->m_random->m_rnd), 0.5 <= fVar21))
     )) {
    if (ppVVar12 != ppVVar10) {
      pSVar17 = (pointer)0x0;
      ppVVar15 = ppVVar12;
      do {
        pVVar19 = *ppVVar15;
        local_148.m_type.m_typeName._M_dataplus._M_p =
             (pointer)(pVVar19->m_valueRange).m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_148.m_type.m_typeName._M_string_length =
             (size_type)
             (pVVar19->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((pointer)local_148.m_type.m_typeName._M_dataplus._M_p ==
            (pVVar19->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_148.m_type.m_typeName._M_dataplus._M_p = (pointer)pSVar17;
        }
        local_148.m_type._0_8_ = &pVVar19->m_valueRange;
        if ((pointer)local_148.m_type.m_typeName._M_string_length ==
            (pVVar19->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_148.m_type.m_typeName._M_string_length = (size_type)pSVar17;
        }
        local_80.m_typeName._M_dataplus._M_p =
             (pointer)(this->m_valueRange).m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_80.m_typeName._M_string_length =
             (size_type)
             (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((pointer)local_80.m_typeName._M_dataplus._M_p ==
            (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_80.m_typeName._M_dataplus._M_p = (pointer)pSVar17;
        }
        if ((pointer)local_80.m_typeName._M_string_length ==
            (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_80.m_typeName._M_string_length = (size_type)pSVar17;
        }
        local_80._0_8_ = this_00;
        bVar7 = ConstValueRangeAccess::isSupersetOf
                          ((ConstValueRangeAccess *)&local_148,(ConstValueRangeAccess *)&local_80);
        local_148.m_type._0_8_ = uVar4;
        local_148.m_type.m_typeName._M_dataplus._M_p = _Var5._M_p;
        local_148.m_type.m_typeName._M_string_length = sVar6;
        if (bVar7) {
          return;
        }
        do {
          ppVVar15 = ppVVar15 + 1;
          if (ppVVar15 == ppVVar20) break;
          bVar7 = rsg::anon_unknown_0::IsWritableIntersectingEntry::operator()
                            ((IsWritableIntersectingEntry *)&local_148,*ppVVar15);
        } while (!bVar7);
      } while (ppVVar15 != ppVVar10);
    }
    pdVar3 = &state->m_random->m_rnd;
    pVVar19 = (ValueEntry *)0x0;
    iVar14 = 0;
    do {
      if ((iVar14 < 1) ||
         (dVar8 = deRandom_getUint32(pdVar3), local_148.m_type._0_8_ = uVar4,
         local_148.m_type.m_typeName._M_dataplus._M_p = _Var5._M_p,
         local_148.m_type.m_typeName._M_string_length = sVar6, dVar8 % (iVar14 + 1U) == 0)) {
        pVVar19 = *ppVVar12;
        local_148.m_type._0_8_ = uVar4;
        local_148.m_type.m_typeName._M_dataplus._M_p = _Var5._M_p;
        local_148.m_type.m_typeName._M_string_length = sVar6;
      }
      do {
        ppVVar12 = ppVVar12 + 1;
        if (ppVVar12 == ppVVar20) break;
        bVar7 = rsg::anon_unknown_0::IsWritableIntersectingEntry::operator()
                          ((IsWritableIntersectingEntry *)&local_148,*ppVVar12);
      } while (!bVar7);
      iVar14 = iVar14 + 1;
    } while (ppVVar12 != ppVVar10);
    local_80._0_8_ = &pVVar19->m_valueRange;
    local_80.m_typeName._M_dataplus._M_p =
         (pointer)(pVVar19->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_80.m_typeName._M_string_length =
         (size_type)
         (pVVar19->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar16 = (Scalar *)0x0;
    if ((Scalar *)local_80.m_typeName._M_dataplus._M_p ==
        (pVVar19->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_80.m_typeName._M_dataplus._M_p = (pointer)pSVar16;
    }
    if ((Scalar *)local_80.m_typeName._M_string_length ==
        (pVVar19->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_80.m_typeName._M_string_length = (size_type)pSVar16;
    }
    local_148.m_type.m_typeName._M_dataplus._M_p =
         (pointer)(this->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_148.m_type.m_typeName._M_string_length =
         (size_type)
         (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if ((Scalar *)local_148.m_type.m_typeName._M_dataplus._M_p ==
        (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_148.m_type.m_typeName._M_dataplus._M_p = (pointer)pSVar16;
    }
    if ((Scalar *)local_148.m_type.m_typeName._M_string_length ==
        (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_148.m_type.m_typeName._M_string_length = (size_type)pSVar16;
    }
    dst.super_ConstValueRangeAccess.m_min = (Scalar *)local_148.m_type.m_typeName._M_dataplus._M_p;
    dst.super_ConstValueRangeAccess.m_type = &this_00->m_type;
    dst.super_ConstValueRangeAccess.m_max = (Scalar *)local_148.m_type.m_typeName._M_string_length;
    local_148.m_type._0_8_ = this_00;
    local_c8 = this_00;
    pSStack_c0 = (Scalar *)local_148.m_type.m_typeName._M_dataplus._M_p;
    local_b8 = (Scalar *)local_148.m_type.m_typeName._M_string_length;
    ValueRange::computeIntersection
              (dst,(ConstValueRangeAccess *)&local_148,(ConstValueRangeAccess *)&local_80);
  }
  return;
}

Assistant:

AssignOp::AssignOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange	(valueRange)
	, m_lvalueExpr	(DE_NULL)
	, m_rvalueExpr	(DE_NULL)
{
	if (m_valueRange.getType().isVoid())
	{
		// Compute random value range
		int		maxScalars		= state.getShaderParameters().maxCombinedVariableScalars - state.getVariableManager().getNumAllocatedScalars();
		bool	useRandomRange	= !state.getVariableManager().hasEntry<IsWritableEntry>() || ((maxScalars > 0) && getWeightedBool(state.getRandom(), 0.1f));

		if (useRandomRange)
		{
			DE_ASSERT(maxScalars > 0);
			m_valueRange = ValueRange(computeRandomType(state, maxScalars));
			computeRandomValueRange(state, m_valueRange.asAccess());
		}
		else
		{
			// Use value range from random entry
			// \todo [2011-02-28 pyry] Give lower weight to entries without range? Choose subtype range?
			const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin<IsWritableEntry>(), state.getVariableManager().getEnd<IsWritableEntry>());
			m_valueRange = ValueRange(entry->getValueRange());

			computeRandomValueRangeForInfElements(state, m_valueRange.asAccess());

			DE_ASSERT(state.getVariableManager().hasEntry(IsWritableIntersectingEntry(m_valueRange.asAccess())));
		}
	}

	IsWritableIntersectingEntry::Iterator first	= state.getVariableManager().getBegin(IsWritableIntersectingEntry(m_valueRange.asAccess()));
	IsWritableIntersectingEntry::Iterator end	= state.getVariableManager().getEnd(IsWritableIntersectingEntry(m_valueRange.asAccess()));

	bool possiblyCreateVar = canAllocateVariable(state, m_valueRange.getType()) &&
							 (first == end || getWeightedBool(state.getRandom(), 0.5f));

	if (!possiblyCreateVar)
	{
		// Find all possible valueranges matching given type and intersecting with valuerange
		// \todo [pyry] Actually collect all ValueRanges, currently operates only on whole variables
		DE_ASSERT(first != end);

		// Try to select one closest to given range but bigger (eg. superset)
		bool supersetExists = false;
		for (IsWritableIntersectingEntry::Iterator i = first; i != end; i++)
		{
			if ((*i)->getValueRange().isSupersetOf(m_valueRange.asAccess()))
			{
				supersetExists = true;
				break;
			}
		}

		if (!supersetExists)
		{
			// Select some other range and compute intersection
			// \todo [2011-02-03 pyry] Use some heuristics to select the range?
			ConstValueRangeAccess selectedRange = state.getRandom().choose<const ValueEntry*>(first, end)->getValueRange();

			ValueRange::computeIntersection(m_valueRange.asAccess(), m_valueRange.asAccess(), selectedRange);
		}
	}
}